

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

string * __thiscall Record::Finds_abi_cxx11_(string *__return_storage_ptr__,Record *this,int c)

{
  string *psVar1;
  string *psVar2;
  pointer pKVar3;
  long lVar4;
  ostream *poVar5;
  string *psVar6;
  allocator local_9;
  
  pKVar3 = (this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = ((long)(this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pKVar3) / 0x28 + 1;
  psVar6 = (string *)&pKVar3[-1].Value;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Cannot Find this Column!");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    psVar1 = psVar6 + 0x28;
    psVar2 = psVar6 + 0x20;
    psVar6 = psVar1;
  } while (*(int *)psVar2 != c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  return __return_storage_ptr__;
}

Assistant:

string Record::Finds(int c) {
	int i;
	for (i = 0; i < KS.size(); i++) {
		if (KS[i].Column == c)break;
	}
	if (i < KS.size())
		return KS[i].Value;
	else {
		cout << "Cannot Find this Column!" << endl;
		return "";
	}
}